

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSync(Pager *pPager,char *zSuper)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  
  psVar1 = pPager->fd->pMethods;
  if (psVar1 == (sqlite3_io_methods *)0x0) {
    iVar2 = 0xc;
  }
  else {
    iVar2 = (*psVar1->xFileControl)(pPager->fd,0x15,zSuper);
  }
  if (iVar2 == 0xc) {
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    if (pPager->noSync == '\0') {
      iVar2 = 0;
      if (pPager->syncFlags != 0) {
        iVar2 = (*pPager->fd->pMethods->xSync)(pPager->fd,(uint)pPager->syncFlags);
        return iVar2;
      }
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSync(Pager *pPager, const char *zSuper){
  int rc = SQLITE_OK;
  void *pArg = (void*)zSuper;
  rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_SYNC, pArg);
  if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  if( rc==SQLITE_OK && !pPager->noSync ){
    assert( !MEMDB );
    rc = sqlite3OsSync(pPager->fd, pPager->syncFlags);
  }
  return rc;
}